

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

ExpEmit __thiscall FxRandom::Emit(FxRandom *this,VMFunctionBuilder *build)

{
  FScriptPosition *pos;
  _func_int **ptr;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int opa;
  DObject *this_00;
  uint uVar4;
  byte bVar5;
  FName local_34;
  
  this_00 = &FindDecorateBuiltinFunction(&local_34,DecoRandom)->super_DObject;
  bVar1 = DObject::IsKindOf(this_00,PSymbolVMFunction::RegistrationInfo.MyClass);
  if (!bVar1) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0xafd,"virtual ExpEmit FxRandom::Emit(VMFunctionBuilder *)");
  }
  ptr = this_00[1]._vptr_DObject;
  if (ptr != (_func_int **)0x0) {
    bVar2 = (this->super_FxExpression).field_0x31;
    iVar3 = VMFunctionBuilder::GetConstantAddress(build,this->rng,'\t');
    VMFunctionBuilder::Emit(build,0x39,0,7,iVar3);
    iVar3 = 1;
    if ((this->min != (FxExpression *)0x0) && (this->max != (FxExpression *)0x0)) {
      pos = &(this->super_FxExpression).ScriptPosition;
      EmitParameter(build,this->min,pos);
      EmitParameter(build,this->max,pos);
      iVar3 = 3;
    }
    opa = VMFunctionBuilder::GetConstantAddress(build,ptr,'\x01');
    VMFunctionBuilder::Emit(build,(uint)bVar2 * 2 + 0x3c,opa,iVar3,1);
    if ((this->super_FxExpression).field_0x31 == '\0') {
      uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      bVar5 = 0;
      VMFunctionBuilder::Emit(build,0x3f,0,0,uVar4 & 0xff);
      bVar2 = 0;
    }
    else {
      bVar2 = 0xff;
      bVar5 = 4;
      uVar4 = 0;
    }
    return (ExpEmit)((uint3)uVar4 & 0xff | (uint3)bVar2 << 8 | (uint3)bVar5 << 0x10);
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0xafe,"virtual ExpEmit FxRandom::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxRandom::Emit(VMFunctionBuilder *build)
{
	// Call DecoRandom to generate a random number.
	VMFunction *callfunc;
	PSymbol *sym = FindDecorateBuiltinFunction(NAME_DecoRandom, DecoRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != NULL);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	if (min != NULL && max != NULL)
	{
		EmitParameter(build, min, ScriptPosition);
		EmitParameter(build, max, ScriptPosition);
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 3, 1);
	}
	else
	{
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 1, 1);
	}

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_INT);
	build->Emit(OP_RESULT, 0, REGT_INT, out.RegNum);
	return out;
}